

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool Js::FunctionProxy::SetDisplayName
               (char16 *srcName,char16 **destName,uint displayNameLength,
               ScriptContext *scriptContext,SetDisplayNameFlags flags)

{
  code *pcVar1;
  DWORD DVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Recycler *this;
  undefined4 in_register_00000014;
  ulong sizeInWords;
  char16 *dst;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._36_4_ = in_register_00000014;
  data.line = displayNameLength;
  if (destName == (char16 **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xaf9,"(destName)","destName");
    if (!bVar3) goto LAB_0076d5b5;
    *puVar5 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xafa,"(scriptContext)","scriptContext");
    if (!bVar3) goto LAB_0076d5b5;
    *puVar5 = 0;
  }
  if (srcName == (char16 *)0x0) {
    *destName = L"";
    bVar3 = false;
  }
  else {
    if ((((((flags & SetDisplayNameFlagsDontCopy) != SetDisplayNameFlagsNone) ||
          (srcName == L"Function code")) || (srcName == L"Unknown script code")) ||
        ((srcName == L"anonymous" || (srcName == L"Module code")))) ||
       ((srcName == L"Global code" || ((srcName == L"glo" || (srcName == L"Anonymous function"))))))
    {
      *destName = srcName;
      return SUB41((flags & SetDisplayNameFlagsRecyclerAllocated) >> 1,0);
    }
    DVar2 = data.line;
    sizeInWords = (ulong)(DVar2 + 1);
    local_60 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0xb0b;
    data.plusSize = sizeInWords;
    this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
    if (DVar2 == 0xffffffff) {
      Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
      dst = (char16 *)&DAT_00000008;
    }
    else {
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_0076d5b5;
        *puVar5 = 0;
      }
      dst = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (this,sizeInWords * 2);
      if (dst == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_0076d5b5:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    *destName = dst;
    js_wmemcpy_s(dst,sizeInWords,srcName,sizeInWords);
    (*destName)[data._32_8_ & 0xffffffff] = L'\0';
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool FunctionProxy::SetDisplayName(const char16* srcName, const char16** destName, uint displayNameLength,  ScriptContext * scriptContext, SetDisplayNameFlags flags /* default to None */)
    {
        Assert(destName);
        Assert(scriptContext);

        if (srcName == nullptr)
        {
            *destName = (_u(""));
            return false;
        }
        else if (IsConstantFunctionName(srcName) || (flags & SetDisplayNameFlagsDontCopy) != 0)
        {
            *destName = srcName;
            return (flags & SetDisplayNameFlagsRecyclerAllocated) != 0; // Return true if array is recycler allocated
        }
        else
        {
            uint  numCharacters =  displayNameLength + 1;
            Assert((flags & SetDisplayNameFlagsDontCopy) == 0);

            *destName = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, numCharacters);
            js_wmemcpy_s((char16 *)*destName, numCharacters, srcName, numCharacters);
            ((char16 *)(*destName))[numCharacters - 1] = _u('\0');

            return true;
        }
    }